

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O1

int __thiscall
FIWadManager::IdentifyVersion
          (FIWadManager *this,TArray<FString,_FString> *wadfiles,char *iwad,char *zdoom_wad)

{
  WadStuff *this_00;
  FIWADInfo *pFVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  WadStuff *pWVar11;
  FIWADInfo *pFVar12;
  ulong uVar13;
  size_t kill;
  ulong uVar14;
  TArray<FString,_FString> *this_01;
  FString FVar15;
  long lVar16;
  TArray<WadStuff,_WadStuff> wads;
  TArray<FString,_FString> gog_paths;
  FString custwad;
  TArray<unsigned_long,_unsigned_long> foundwads;
  TArray<FString,_FString> steam_path;
  FString nice;
  TArray<WadStuff,_WadStuff> local_b8;
  TArray<FString,_FString> *local_a0;
  UCVarValue local_98;
  uint local_8c;
  FString local_88;
  ulong local_80;
  TArray<unsigned_long,_unsigned_long> local_78;
  TArray<FString,_FString> local_68;
  ulong local_58;
  FString local_50;
  char *local_48;
  unsigned_long *local_40;
  UCVarValue local_38;
  
  local_b8.Array = (WadStuff *)0x0;
  local_b8.Most = 0;
  local_b8.Count = 0;
  local_78.Array = (unsigned_long *)0x0;
  local_78.Most = 0;
  local_78.Count = 0;
  local_48 = zdoom_wad;
  pcVar7 = DArgs::CheckValue(Args,"-iwad");
  local_38 = (UCVarValue)FString::NullString.Nothing;
  local_88.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  TArray<WadStuff,_WadStuff>::Resize(&local_b8,(this->mIWadNames).Count);
  TArray<unsigned_long,_unsigned_long>::Resize(&local_78,(this->mIWads).Count);
  memset(local_78.Array,0,((ulong)local_78._8_8_ >> 0x20) << 3);
  if ((iwad != (char *)0x0 && pcVar7 == (char *)0x0) && (pcVar7 = (char *)0x0, *iwad != '\0')) {
    pcVar7 = iwad;
  }
  if (pcVar7 != (char *)0x0) {
    FString::operator=(&local_88,pcVar7);
    FString::ReplaceChars(&local_88,'\\','/');
    iVar4 = CheckIWAD(this,local_88.Chars,local_b8.Array);
    if (iVar4 == 0) {
      DefaultExtension(&local_88,".wad");
      FVar15.Chars = local_88.Chars;
      FString::operator=((this->mIWadNames).Array,&local_88);
      CheckIWAD(this,(char *)"",local_b8.Array);
      goto LAB_004894c3;
    }
  }
  FVar15.Chars = (char *)0x0;
LAB_004894c3:
  local_a0 = wadfiles;
  if (((FVar15.Chars == (char *)0x0) || (*(int *)(((local_b8.Array)->Path).Chars + -0xc) == 0)) ||
     (*(int *)((this->mIWads).Array[(local_b8.Array)->Type].Required.Chars + -0xc) != 0)) {
    bVar3 = FConfigFile::SetSection(&GameConfig->super_FConfigFile,"IWADSearch.Directories",false);
    if (bVar3) {
      while (bVar3 = FConfigFile::NextInSection
                               (&GameConfig->super_FConfigFile,&local_98.String,(char **)&local_68),
            bVar3) {
        iVar4 = strcasecmp(local_98.String,"Path");
        if (iVar4 == 0) {
          NicePath((char *)&local_50);
          FString::ReplaceChars(&local_50,'\\','/');
          CheckIWAD(this,local_50.Chars,local_b8.Array);
          FString::~FString(&local_50);
        }
      }
    }
    I_GetGogPaths();
    if (local_8c != 0) {
      uVar8 = 0;
      do {
        CheckIWAD(this,*(char **)(local_98.String + uVar8 * 8),local_b8.Array);
        uVar8 = uVar8 + 1;
      } while (uVar8 < local_8c);
    }
    I_GetSteamPath();
    if (local_68.Count != 0) {
      uVar8 = 0;
      do {
        CheckIWAD(this,local_68.Array[uVar8].Chars,local_b8.Array);
        uVar8 = uVar8 + 1;
      } while (uVar8 < local_68.Count);
    }
    TArray<FString,_FString>::~TArray(&local_68);
    TArray<FString,_FString>::~TArray((TArray<FString,_FString> *)&local_98);
  }
  if (FVar15.Chars == (char *)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = *(int *)(((local_b8.Array)->Path).Chars + -0xc) == 0;
  }
  if ((this->mIWadNames).Count == 0) {
    local_80 = 0;
  }
  else {
    lVar9 = 0;
    uVar14 = 0;
    uVar8 = 0;
    do {
      pWVar11 = local_b8.Array;
      local_80 = uVar8;
      if (*(int *)(*(long *)((long)&((local_b8.Array)->Path).Chars + lVar9) + -0xc) != 0) {
        if (uVar14 != uVar8) {
          this_00 = local_b8.Array + uVar8;
          FString::operator=(&this_00->Path,
                             (FString *)((long)&((local_b8.Array)->Path).Chars + lVar9));
          FString::operator=(&this_00->Name,(FString *)((long)&(pWVar11->Name).Chars + lVar9));
          this_00->Type = *(int *)((long)&pWVar11->Type + lVar9);
        }
        local_80 = uVar8 + 1;
        local_78.Array[local_b8.Array[uVar8].Type] = local_80;
      }
      uVar14 = uVar14 + 1;
      lVar9 = lVar9 + 0x18;
      uVar8 = local_80;
    } while (uVar14 < (this->mIWadNames).Count);
  }
  uVar6 = (this->mIWads).Count;
  uVar8 = (ulong)uVar6;
  if (uVar6 != 0) {
    uVar14 = 0;
    do {
      pFVar1 = (this->mIWads).Array;
      pcVar7 = pFVar1[uVar14].Required.Chars;
      if ((*(int *)(pcVar7 + -0xc) != 0) && (uVar13 = local_78.Array[uVar14], uVar13 != 0)) {
        local_40 = local_78.Array;
        uVar10 = 0;
        pFVar12 = pFVar1;
        local_58 = uVar14;
        do {
          iVar4 = strcmp(pcVar7,(pFVar12->Name).Chars);
          uVar2 = local_80;
          if (iVar4 == 0) {
            if (local_40[uVar10] != 0) {
              pFVar1[uVar14].preload = (int)uVar10;
              uVar14 = local_58;
              goto LAB_00489812;
            }
            break;
          }
          uVar10 = uVar10 + 1;
          pFVar12 = pFVar12 + 1;
        } while ((int)uVar8 + (uint)((int)uVar8 == 0) != uVar10);
        lVar9 = local_80 - uVar13;
        if (uVar13 <= local_80 && lVar9 != 0) {
          lVar16 = uVar13 * 0x18;
          do {
            pWVar11 = local_b8.Array;
            FString::operator=((FString *)((long)&local_b8.Array[-1].Path.Chars + lVar16),
                               (FString *)((long)&((local_b8.Array)->Path).Chars + lVar16));
            FString::operator=((FString *)((long)pWVar11 + lVar16 + -0x10),
                               (FString *)((long)&(pWVar11->Name).Chars + lVar16));
            *(undefined4 *)((long)pWVar11 + lVar16 + -8) =
                 *(undefined4 *)((long)&pWVar11->Type + lVar16);
            lVar16 = lVar16 + 0x18;
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
        }
        local_80 = uVar2 - 1;
        local_78.Array[local_58] = 0;
        uVar14 = local_58;
        if ((ulong)local_78._8_8_ >> 0x20 != 0) {
          uVar8 = 0;
          do {
            if (uVar13 < local_78.Array[uVar8]) {
              local_78.Array[uVar8] = local_78.Array[uVar8] - 1;
            }
            uVar8 = uVar8 + 1;
          } while ((ulong)local_78._8_8_ >> 0x20 != uVar8);
        }
      }
LAB_00489812:
      uVar14 = uVar14 + 1;
      uVar8 = (ulong)(this->mIWads).Count;
    } while (uVar14 < uVar8);
  }
  uVar8 = local_80;
  this_01 = local_a0;
  if (local_80 == 0) {
    I_FatalError(
                "Cannot find a game IWAD (doom.wad, doom2.wad, heretic.wad, etc.).\nDid you install GZDoom properly? You can do either of the following:\n\n1. Place one or more of these wads in ~/.config/gzdoom/.\n2. Edit your ~/.config/gzdoom/gzdoom.ini and add the directories of your\niwads to the list beneath [IWADSearch.Directories]"
                );
  }
  uVar14 = 0;
  iVar4 = 0;
  if (bVar3 && 1 < uVar8) {
    uVar14 = uVar8;
    if (*defaultiwad.Value != '\0') {
      lVar9 = 0;
      uVar10 = 0;
      uVar13 = 0;
      do {
        ExtractFileBase((char *)&local_98.Int,
                        SUB81(*(undefined8 *)((long)&((local_b8.Array)->Path).Chars + lVar9),0));
        iVar5 = strcasecmp(local_98.String,defaultiwad.Value);
        FString::~FString((FString *)&local_98);
        if (iVar5 == 0) {
          uVar10 = uVar13 & 0xffffffff;
        }
        iVar4 = (int)uVar10;
        uVar14 = local_80;
        if (iVar5 == 0) break;
        lVar9 = lVar9 + 0x18;
        bVar3 = uVar8 - 1 != uVar13;
        uVar13 = uVar13 + 1;
      } while (bVar3);
    }
    if (havepicked == '\0') {
      uVar6 = I_PickIWad(local_b8.Array,(int)uVar14,queryiwad.Value,iVar4);
      this_01 = local_a0;
      uVar14 = (ulong)uVar6;
      if ((int)uVar6 < 0) {
        exit(0);
      }
      ExtractFileBase((char *)&local_98.Int,SUB81(local_b8.Array[uVar14].Path.Chars,0));
      FBaseCVar::SetGenericRep(&defaultiwad.super_FBaseCVar,local_98,CVAR_String);
      FString::~FString((FString *)&local_98);
      havepicked = '\x01';
    }
    else {
      uVar14 = 0;
      this_01 = local_a0;
    }
  }
  if (this_01->Count != 0) {
    TArray<FString,_FString>::DoDelete(this_01,0,this_01->Count - 1);
    this_01->Count = 0;
  }
  D_AddFile(this_01,local_48,true,-1);
  lVar9 = (long)(this->mIWads).Array[local_b8.Array[uVar14].Type].preload;
  if (-1 < lVar9) {
    D_AddFile(this_01,local_b8.Array[local_78.Array[lVar9] - 1].Path.Chars,true,-1);
  }
  D_AddFile(this_01,local_b8.Array[uVar14].Path.Chars,true,-1);
  iVar4 = local_b8.Array[uVar14].Type;
  if ((this->mIWads).Array[iVar4].Load.Count != 0) {
    pWVar11 = local_b8.Array + uVar14;
    lVar9 = 0;
    uVar8 = 0;
    do {
      lVar16 = FString::LastIndexOf(&pWVar11->Path,'/');
      local_98 = local_38;
      FString::NullString.RefCount = FString::NullString.RefCount + 1;
      if (lVar16 == -1) {
        FString::operator=((FString *)&local_98,(char *)"");
      }
      else {
        FString::FString((FString *)&local_68,local_b8.Array[uVar14].Path.Chars,lVar16 + 1);
        FString::operator=((FString *)&local_98,(FString *)&local_68);
        FString::~FString((FString *)&local_68);
      }
      FString::operator+=((FString *)&local_98,
                          (FString *)
                          ((long)&((this->mIWads).Array[local_b8.Array[uVar14].Type].Load.Array)->
                                  Chars + lVar9));
      D_AddFile(this_01,local_98.String,true,-1);
      FString::~FString((FString *)&local_98);
      uVar8 = uVar8 + 1;
      pWVar11 = local_b8.Array + uVar14;
      iVar4 = pWVar11->Type;
      lVar9 = lVar9 + 8;
    } while (uVar8 < (this->mIWads).Array[iVar4].Load.Count);
  }
  FString::~FString(&local_88);
  TArray<unsigned_long,_unsigned_long>::~TArray(&local_78);
  TArray<WadStuff,_WadStuff>::~TArray(&local_b8);
  return iVar4;
}

Assistant:

int FIWadManager::IdentifyVersion (TArray<FString> &wadfiles, const char *iwad, const char *zdoom_wad)
{
	TArray<WadStuff> wads;
	TArray<size_t> foundwads;
	const char *iwadparm = Args->CheckValue ("-iwad");
	int pickwad;
	size_t numwads;
	size_t i;
	bool iwadparmfound = false;
	FString custwad;

	wads.Resize(mIWadNames.Size());
	foundwads.Resize(mIWads.Size());
	memset(&foundwads[0], 0, foundwads.Size() * sizeof(foundwads[0]));

	if (iwadparm == NULL && iwad != NULL && *iwad != 0)
	{
		iwadparm = iwad;
	}

	if (iwadparm)
	{
		custwad = iwadparm;
		FixPathSeperator (custwad);
		if (CheckIWAD (custwad, &wads[0]))
		{ // -iwad parameter was a directory
			iwadparm = NULL;
		}
		else
		{
			DefaultExtension (custwad, ".wad");
			iwadparm = custwad;
			mIWadNames[0] = custwad;
			CheckIWAD ("", &wads[0]);
		}
	}

	if (iwadparm == NULL || wads[0].Path.IsEmpty() || mIWads[wads[0].Type].Required.IsNotEmpty())
	{
		if (GameConfig->SetSection ("IWADSearch.Directories"))
		{
			const char *key;
			const char *value;

			while (GameConfig->NextInSection (key, value))
			{
				if (stricmp (key, "Path") == 0)
				{
					FString nice = NicePath(value);
					FixPathSeperator(nice);
					CheckIWAD(nice, &wads[0]);
				}
			}
		}
		TArray<FString> gog_paths = I_GetGogPaths();
		for (i = 0; i < gog_paths.Size(); ++i)
		{
			CheckIWAD (gog_paths[i], &wads[0]);
		}
		TArray<FString> steam_path = I_GetSteamPath();
		for (i = 0; i < steam_path.Size(); ++i)
		{
			CheckIWAD (steam_path[i], &wads[0]);
		}
	}

	if (iwadparm != NULL && !wads[0].Path.IsEmpty())
	{
		iwadparmfound = true;
	}

	for (i = numwads = 0; i < mIWadNames.Size(); i++)
	{
		if (!wads[i].Path.IsEmpty())
		{
			if (i != numwads)
			{
				wads[numwads] = wads[i];
			}
			foundwads[wads[numwads].Type] = numwads + 1;
			numwads++;
		}
	}

	for (unsigned i=0; i<mIWads.Size(); i++)
	{
		if (mIWads[i].Required.IsNotEmpty() && foundwads[i])
		{
			bool found = false;
			// needs to be loaded with another IWAD (HexenDK)
			for (unsigned j=0; j<mIWads.Size(); j++)
			{
				if (!mIWads[i].Required.Compare(mIWads[j].Name))
				{
					if (foundwads[j])
					{
						found = true;
						mIWads[i].preload = j;
					}
					break;
				}
			}
			// The required WAD is not there so this one can't be used and must be deleted from the list
			if (!found)
			{
				size_t kill = foundwads[i];
				for (size_t j = kill; j < numwads; ++j)
				{
					wads[j - 1] = wads[j];
				}
				numwads--;
				foundwads[i] = 0;
				for (unsigned j = 0; j < foundwads.Size(); ++j)
				{
					if (foundwads[j] > kill)
					{
						foundwads[j]--;
					}
				}

			}
		}
	}

	if (numwads == 0)
	{
		I_FatalError ("Cannot find a game IWAD (doom.wad, doom2.wad, heretic.wad, etc.).\n"
					  "Did you install " GAMENAME " properly? You can do either of the following:\n"
					  "\n"
#if defined(_WIN32)
					  "1. Place one or more of these wads in the same directory as " GAMENAME ".\n"
					  "2. Edit your " GAMENAMELOWERCASE "-username.ini and add the directories of your iwads\n"
					  "to the list beneath [IWADSearch.Directories]");
#elif defined(__APPLE__)
					  "1. Place one or more of these wads in ~/Library/Application Support/GZdoom/\n"
					  "2. Edit your ~/Library/Application Support/GZdoom/GZdoom.ini and add the directories\n"
					  "of your iwads to the list beneath [IWADSearch.Directories]");
#else
					  "1. Place one or more of these wads in ~/.config/" GAMENAMELOWERCASE "/.\n"
					  "2. Edit your ~/.config/" GAMENAMELOWERCASE "/" GAMENAMELOWERCASE ".ini and add the directories of your\n"
					  "iwads to the list beneath [IWADSearch.Directories]");
#endif
	}

	pickwad = 0;

	if (!iwadparmfound && numwads > 1)
	{
		int defiwad = 0;

		// Locate the user's prefered IWAD, if it was found.
		if (defaultiwad[0] != '\0')
		{
			for (i = 0; i < numwads; ++i)
			{
				FString basename = ExtractFileBase(wads[i].Path);
				if (stricmp(basename, defaultiwad) == 0)
				{
					defiwad = (int)i;
					break;
				}
			}
		}
		if (!havepicked)	// just use the first IWAD if the restart doesn't have a -iwad parameter. We cannot open the picker in fullscreen mode.
		{
			pickwad = I_PickIWad(&wads[0], (int)numwads, queryiwad, defiwad);
			if (pickwad >= 0)
			{
				// The newly selected IWAD becomes the new default
				FString basename = ExtractFileBase(wads[pickwad].Path);
				defaultiwad = basename;
			}
			if (pickwad < 0)
				exit(0);
			havepicked = true;
		}
	}

	// zdoom.pk3 must always be the first file loaded and the IWAD second.
	wadfiles.Clear();
	D_AddFile (wadfiles, zdoom_wad);

	if (mIWads[wads[pickwad].Type].preload >= 0)
	{
		D_AddFile (wadfiles, wads[foundwads[mIWads[wads[pickwad].Type].preload]-1].Path);
	}
	D_AddFile (wadfiles, wads[pickwad].Path);

	for (unsigned i=0; i < mIWads[wads[pickwad].Type].Load.Size(); i++)
	{
		long lastslash = wads[pickwad].Path.LastIndexOf ('/');
		FString path;

		if (lastslash == -1)
		{
			path = "";//  wads[pickwad].Path;
		}
		else
		{
			path = FString (wads[pickwad].Path.GetChars(), lastslash + 1);
		}
		path += mIWads[wads[pickwad].Type].Load[i];
		D_AddFile (wadfiles, path);

	}
	return wads[pickwad].Type;
}